

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcSymDynLocal::gen_code(CTcSymDynLocal *this,int discard)

{
  int in_ESI;
  ulong in_RDI;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 0) {
    CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
    CTcDataStream::write_obj_id((CTcDataStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI);
    CTcGenTarg::note_push((CTcGenTarg *)0x2850ad);
    CTPNConst::s_gen_code_int(0x2850ba);
    CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
    CTcGenTarg::note_pop(G_cg,1);
    if (*(int *)(in_RDI + 0x30) != 0) {
      CTPNConst::s_gen_code_int(0x2850f9);
      CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
      CTcGenTarg::note_pop(G_cg,1);
    }
  }
  return;
}

Assistant:

void CTcSymDynLocal::gen_code(int discard)
{
    /* there are no side effects, so do nothing if discarding the value */
    if (discard)
        return;

    /* 
     *   to retrieve a dynamic frame local, we simply need to evaluate
     *   fref[index], where 'fref' is the StackFrameRef object and 'index' is
     *   an integer giving the frame index of the variable 
     */

    /* push the frame object */
    G_cg->write_op(OPC_PUSHOBJ);
    G_cs->write_obj_id(fref_);
    G_cg->note_push();

    /* push the variable's frame index */
    CTPNConst::s_gen_code_int(varnum_);

    /* index the frame object */
    G_cg->write_op(OPC_INDEX);

    /* INDEX pops two items and pushes one for a net of one pop */
    G_cg->note_pop(1);

    /* 
     *   if this is a context local, we now have the context object, so we
     *   need to further index it by the variable's context index 
     */
    if (ctxidx_ != 0)
    {
        /* index the context object by the context index */
        CTPNConst::s_gen_code_int(ctxidx_);
        G_cg->write_op(OPC_INDEX);

        /* INDEX pops two items and pushes one */
        G_cg->note_pop(1);
    }
}